

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::run_impl(QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
           *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  bool bVar1;
  QueueTesterFlags QVar2;
  size_type sVar3;
  reference pvVar4;
  IncrementalStats *pIVar5;
  atomic<unsigned_long> *paVar6;
  LineUpdaterStreamAdapter *pLVar7;
  reference pPVar8;
  ulong in_RCX;
  long lVar9;
  EasyRandom *in_RDX;
  QueueTesterFlags in_ESI;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  PutTypeCounters *counter;
  iterator __end0_2;
  iterator __begin0_2;
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
  *__range2_1;
  long spawned;
  FinalStats *thread_state;
  size_t thread_index_2;
  FinalStats final_state;
  histogram<long,_true> histogram_except_cons;
  histogram<long,_true> histogram_except_puts;
  histogram<long,_true> histogram_spawned;
  ThreadData *thread_1;
  iterator __end0_1;
  iterator __begin0_1;
  aligned_vector<ThreadData>_conflict29 *__range2;
  size_t enqueued;
  double enqueued_ratio;
  bool too_many_enqueued;
  ThreadData *thread;
  iterator __end0;
  iterator __begin0;
  aligned_vector<ThreadData>_conflict29 *__range4;
  size_t active_threads;
  size_t consumed;
  size_t produced;
  Progress progress;
  bool complete;
  LineUpdaterStreamAdapter line;
  bool concurrent_consumes;
  bool concurrent_puts;
  size_t thread_consume_count;
  size_t thread_put_count;
  uint64_t thread_affinity;
  size_t thread_index_1;
  bool reserve_core1_to_main;
  uint64_t num_of_processors;
  size_t thread_index;
  FeedBack feedback;
  aligned_vector<ThreadData>_conflict29 threads;
  lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  queue;
  bool with_exceptions;
  size_type case_count;
  memory_order __b_1;
  memory_order __b;
  unsigned_long local_a18;
  bool local_a09;
  bool local_9b9;
  __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>_>
  local_998;
  __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>_>
  local_990;
  vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>
  *local_988;
  PutTypeCounters *local_978;
  PutTypeCounters *local_970;
  long local_968;
  FinalStats *local_960;
  ulong local_958;
  FinalStats local_950 [40];
  histogram<long,_true> local_928;
  histogram<long,_true> local_788;
  histogram<long,_true> local_5e8;
  reference local_448;
  __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>_>
  local_440;
  __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>_>
  local_438;
  vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
  *local_430;
  int local_424;
  duration<long,_std::ratio<1L,_1000L>_> local_420;
  unsigned_long local_418;
  double local_410;
  bool local_401;
  reference local_400;
  __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>_>
  local_3f8;
  __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>_>
  local_3f0;
  vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
  *local_3e8;
  unsigned_long local_3e0;
  unsigned_long local_3d8;
  ulong local_3d0;
  Progress local_3c8;
  bool local_3a1;
  LineUpdaterStreamAdapter local_3a0;
  undefined1 local_1f2;
  undefined1 local_1f1;
  ulong local_1f0;
  ulong local_1e8;
  unsigned_long local_1e0;
  ulong local_1d8;
  bool local_1c9;
  ulong local_1c8;
  atomic<bool> *local_1c0;
  ulong local_1b8;
  atomic<bool> local_199;
  vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
  local_198;
  lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  local_180;
  byte local_a9;
  size_type local_a8;
  ulong local_a0;
  EasyRandom *local_98;
  QueueTesterFlags local_8c [3];
  __int_type local_80;
  memory_order local_78;
  int local_74;
  atomic<unsigned_long> *local_70;
  __int_type local_68;
  memory_order local_60;
  int local_5c;
  IncrementalStats *local_58;
  
  local_a0 = in_RCX;
  local_98 = in_RDX;
  local_8c[0] = in_ESI;
  local_a8 = std::
             unordered_map<density::runtime_type<>,_unsigned_long,_std::hash<density::runtime_type<>_>,_std::equal_to<density::runtime_type<>_>,_std::allocator<std::pair<const_density::runtime_type<>,_unsigned_long>_>_>
             ::size(&in_RDI->m_element_types);
  sVar3 = std::
          vector<bool_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&)>_>
          ::size((vector<bool_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&)>_>
                  *)&in_RDI->m_put_cases);
  if ((((sVar3 != local_a8) ||
       (sVar3 = std::
                vector<void_(*)(const_density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::consume_operation_&),_std::allocator<void_(*)(const_density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::consume_operation_&)>_>
                ::size((vector<void_(*)(const_density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::consume_operation_&),_std::allocator<void_(*)(const_density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::consume_operation_&)>_>
                        *)&in_RDI->m_consume_cases), sVar3 != local_a8)) ||
      (sVar3 = std::
               vector<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::reentrant_put_transaction<void>_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&),_std::allocator<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::reentrant_put_transaction<void>_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&)>_>
               ::size((vector<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::reentrant_put_transaction<void>_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&),_std::allocator<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::reentrant_put_transaction<void>_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&)>_>
                       *)&in_RDI->m_reentrant_put_cases), sVar3 != local_a8)) ||
     (sVar3 = std::
              vector<void_(*)(const_density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::reentrant_consume_operation_&),_std::allocator<void_(*)(const_density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::reentrant_consume_operation_&)>_>
              ::size((vector<void_(*)(const_density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::reentrant_consume_operation_&),_std::allocator<void_(*)(const_density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>::reentrant_consume_operation_&)>_>
                      *)&in_RDI->m_reentrant_consume_cases), sVar3 != local_a8)) {
    detail::assert_failed<>
              ("m_put_cases.size() == case_count && m_consume_cases.size() == case_count && m_reentrant_put_cases.size() == case_count && m_reentrant_consume_cases.size() == case_count"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x75);
  }
  QVar2 = operator&(local_8c[0],eTestExceptions);
  local_a9 = QVar2 != eNone;
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::lf_heter_queue(&local_180);
  std::
  vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
  ::vector(&local_198);
  FeedBack::FeedBack((FeedBack *)&local_199);
  std::
  vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
  ::reserve(&local_198,in_RDI->m_thread_count);
  for (local_1b8 = 0; local_1b8 < in_RDI->m_thread_count; local_1b8 = local_1b8 + 1) {
    local_1c0 = &local_199;
    std::
    vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::ThreadData>>
    ::
    emplace_back<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>const&,density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::FeedBack*,density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&,density_tests::QueueTesterFlags&>
              ((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::ThreadData>>
                *)&local_198,in_RDI,(FeedBack **)&local_1c0,&local_180,local_98,local_8c);
  }
  local_1c8 = get_num_of_processors();
  local_9b9 = operator&&(local_8c[0],eReserveCoreToMainThread);
  local_9b9 = local_9b9 && 3 < local_1c8;
  local_1c9 = local_9b9;
  for (local_1d8 = 0; local_1d8 < in_RDI->m_thread_count; local_1d8 = local_1d8 + 1) {
    local_1e0 = std::numeric_limits<unsigned_long>::max();
    if ((local_1c9 & 1U) != 0) {
      local_1e0 = local_1e0 - 2;
    }
    local_1f1 = 1;
    local_1f2 = 1;
    local_1e8 = local_a0 / in_RDI->m_thread_count;
    if (local_1d8 == 0) {
      local_1e8 = local_a0 % in_RDI->m_thread_count + local_1e8;
    }
    local_1f0 = local_a0 / in_RDI->m_thread_count;
    if (local_1d8 == 0) {
      local_1f0 = local_a0 % in_RDI->m_thread_count + local_1f0;
    }
    if (local_1c8 < 2) {
      local_1e0 = std::numeric_limits<unsigned_long>::max();
    }
    pvVar4 = std::
             vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
             ::operator[](&local_198,local_1d8);
    ThreadData::start((ThreadData *)pvVar4,local_1d8,local_1e8,local_1f0,local_1e0);
  }
  LineUpdaterStreamAdapter::LineUpdaterStreamAdapter(&local_3a0,in_RDI->m_output);
  local_3a1 = false;
  Progress::Progress(&local_3c8,local_a0);
  while (((local_3a1 ^ 0xffU) & 1) != 0) {
    local_3d0 = 0;
    local_3d8 = 0;
    local_3e0 = 0;
    local_3e8 = &local_198;
    local_3f0._M_current =
         (ThreadData *)
         std::
         vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
         ::begin(local_3e8);
    local_3f8._M_current =
         (ThreadData *)
         std::
         vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
         ::end(local_3e8);
    while (bVar1 = __gnu_cxx::operator!=(&local_3f0,&local_3f8), bVar1) {
      local_400 = __gnu_cxx::
                  __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>_>
                  ::operator*(&local_3f0);
      pIVar5 = ThreadData::incremental_stats((ThreadData *)local_400);
      local_5c = 5;
      local_58 = pIVar5;
      local_60 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_5c - 1U < 2) {
        local_68 = (pIVar5->m_produced).super___atomic_base<unsigned_long>._M_i;
      }
      else if (local_5c == 5) {
        local_68 = (pIVar5->m_produced).super___atomic_base<unsigned_long>._M_i;
      }
      else {
        local_68 = (pIVar5->m_produced).super___atomic_base<unsigned_long>._M_i;
      }
      local_3d0 = local_3d0 + local_68;
      pIVar5 = ThreadData::incremental_stats((ThreadData *)local_400);
      paVar6 = &pIVar5->m_consumed;
      local_74 = 5;
      local_70 = paVar6;
      local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_74 - 1U < 2) {
        local_80 = (paVar6->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (local_74 == 5) {
        local_80 = (paVar6->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        local_80 = (paVar6->super___atomic_base<unsigned_long>)._M_i;
      }
      local_3d8 = local_3d8 + local_80;
      pIVar5 = ThreadData::incremental_stats((ThreadData *)local_400);
      bVar1 = std::atomic<bool>::load(&pIVar5->m_thread_is_active,memory_order_seq_cst);
      local_3e0 = (long)(int)(uint)bVar1 + local_3e0;
      __gnu_cxx::
      __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>_>
      ::operator++(&local_3f0);
    }
    if ((local_a0 < local_3d8) || (local_a0 < local_3d0)) {
      detail::assert_failed<>
                ("consumed <= i_target_put_count && produced <= i_target_put_count",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0xd7);
    }
    local_a09 = local_a0 <= local_3d8 && local_a0 <= local_3d0;
    local_3a1 = local_a09;
    local_401 = false;
    if (local_3d8 < local_3d0) {
      lVar9 = local_3d0 - local_3d8;
      auVar10._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar10._0_8_ = lVar9;
      auVar10._12_4_ = 0x45300000;
      auVar11._8_4_ = (int)(local_3d8 >> 0x20);
      auVar11._0_8_ = local_3d8;
      auVar11._12_4_ = 0x45300000;
      local_410 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                  ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_3d8) - 4503599627370496.0));
      local_401 = 0.2 < local_410;
    }
    std::atomic<bool>::store(&local_199,local_401,memory_order_relaxed);
    bVar1 = operator&&(local_8c[0],ePrintProgress);
    if (bVar1) {
      if (local_3d0 < local_3d8) {
        local_a18 = 0;
      }
      else {
        local_a18 = local_3d0 - local_3d8;
      }
      local_418 = local_a18;
      Progress::set_progress(&local_3c8,local_3d8);
      pLVar7 = LineUpdaterStreamAdapter::operator<<(&local_3a0,(char (*) [17])"Active threads: ");
      pLVar7 = LineUpdaterStreamAdapter::operator<<(pLVar7,&local_3e0);
      pLVar7 = LineUpdaterStreamAdapter::operator<<(pLVar7,(char (*) [13])", Consumed: ");
      pLVar7 = LineUpdaterStreamAdapter::operator<<(pLVar7,&local_3d8);
      pLVar7 = LineUpdaterStreamAdapter::operator<<(pLVar7,(char (*) [3])" (");
      pLVar7 = LineUpdaterStreamAdapter::operator<<(pLVar7,&local_3c8);
      pLVar7 = LineUpdaterStreamAdapter::operator<<(pLVar7,(char (*) [14])"), enqueued: ");
      pLVar7 = LineUpdaterStreamAdapter::operator<<(pLVar7,&local_418);
      LineUpdaterStreamAdapter::operator<<(pLVar7,std::endl<char,std::char_traits<char>>);
    }
    if ((local_3a1 & 1U) == 0) {
      local_424 = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_420,&local_424);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_420);
    }
  }
  LineUpdaterStreamAdapter::~LineUpdaterStreamAdapter(&local_3a0);
  local_430 = &local_198;
  local_438._M_current =
       (ThreadData *)
       std::
       vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
       ::begin(local_430);
  local_440._M_current =
       (ThreadData *)
       std::
       vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
       ::end(local_430);
  while (bVar1 = __gnu_cxx::operator!=(&local_438,&local_440), bVar1) {
    local_448 = __gnu_cxx::
                __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>_>
                ::operator*(&local_438);
    ThreadData::join((ThreadData *)local_448);
    __gnu_cxx::
    __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>_>
    ::operator++(&local_438);
  }
  histogram<long,_true>::histogram(&local_5e8,"spawned by i-th thread",0x19,8);
  histogram<long,_true>::histogram(&local_788,"exceptions_during_puts",0x19,8);
  histogram<long,_true>::histogram(&local_928,"exceptions_during_consumes",0x19,8);
  sVar3 = std::
          vector<bool_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&)>_>
          ::size((vector<bool_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_&,_density_tests::EasyRandom_&)>_>
                  *)&in_RDI->m_put_cases);
  FinalStats::FinalStats(local_950,sVar3);
  for (local_958 = 0; local_958 < in_RDI->m_thread_count; local_958 = local_958 + 1) {
    pvVar4 = std::
             vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
             ::operator[](&local_198,local_958);
    local_960 = ThreadData::final_stats((ThreadData *)pvVar4);
    FinalStats::operator+=(local_950,local_960);
    local_970 = (PutTypeCounters *)
                std::
                vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>
                ::begin((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>
                         *)local_960);
    local_978 = (PutTypeCounters *)
                std::
                vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>
                ::end((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>
                       *)local_960);
    local_968 = std::
                accumulate<__gnu_cxx::__normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::PutTypeCounters_const*,std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::PutTypeCounters,std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::PutTypeCounters>>>,long,density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::run_impl(density_tests::QueueTesterFlags,density_tests::EasyRandom&,unsigned_long)const::_lambda(long,density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::PutTypeCounters_const&)_1_>
                          (local_970,local_978,0);
    histogram<long,_true>::operator<<(&local_5e8,&local_968);
    if ((local_a9 & 1) != 0) {
      histogram<long,_true>::operator<<(&local_788,&local_960->m_exceptions_during_puts);
      histogram<long,_true>::operator<<(&local_928,&local_960->m_exceptions_during_consumes);
    }
  }
  local_988 = (vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>
               *)local_950;
  local_990._M_current =
       (PutTypeCounters *)
       std::
       vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>
       ::begin(local_988);
  local_998._M_current =
       (PutTypeCounters *)
       std::
       vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>
       ::end(local_988);
  while (bVar1 = __gnu_cxx::operator!=(&local_990,&local_998), bVar1) {
    pPVar8 = __gnu_cxx::
             __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>_>
             ::operator*(&local_990);
    if (pPVar8->m_existing != 0) {
      detail::assert_failed<>
                ("counter.m_existing == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0x114);
    }
    __gnu_cxx::
    __normal_iterator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters_*,_std::vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::PutTypeCounters>_>_>
    ::operator++(&local_990);
  }
  density_tests::operator<<(in_RDI->m_output,&local_5e8);
  if ((local_a9 & 1) != 0) {
    density_tests::operator<<(in_RDI->m_output,&local_788);
    density_tests::operator<<(in_RDI->m_output,&local_928);
  }
  FinalStats::~FinalStats(local_950);
  histogram<long,_true>::~histogram(&local_928);
  histogram<long,_true>::~histogram(&local_788);
  histogram<long,_true>::~histogram(&local_5e8);
  std::
  vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadData>_>
  ::~vector(&local_198);
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_180);
  return;
}

Assistant:

void
          run_impl(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            auto const case_count = m_element_types.size();
            DENSITY_TEST_ASSERT(
              m_put_cases.size() == case_count && m_consume_cases.size() == case_count &&
              m_reentrant_put_cases.size() == case_count &&
              m_reentrant_consume_cases.size() == case_count);

            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            QUEUE queue;

            /* prepare the array of threads. The initialization of the random generator
                may take some time, so we do it before starting the threads. */
            aligned_vector<ThreadData> threads;
            FeedBack                   feedback;
            threads.reserve(m_thread_count);
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                threads.emplace_back(*this, &feedback, queue, i_random, i_flags);
            }

            uint64_t const num_of_processors = get_num_of_processors();
            bool const     reserve_core1_to_main =
              (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;

            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                uint64_t thread_affinity  = std::numeric_limits<uint64_t>::max();
                size_t   thread_put_count = 0, thread_consume_count = 0;

                if (reserve_core1_to_main)
                    thread_affinity -= 2;

                auto concurrent_puts     = QUEUE::concurrent_puts;
                auto concurrent_consumes = QUEUE::concurrent_consumes;

                if (concurrent_puts)
                {
                    // distribute the puts to the threads - the first thread gets the remainder
                    thread_put_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_put_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow puts only to the first thread, and reserve the first core to it
                    if (thread_index == 0)
                    {
                        thread_put_count = i_target_put_count;
                        thread_affinity  = 1;
                    }
                    else
                    {
                        thread_affinity ^= 1;
                    }
                }

                if (concurrent_consumes)
                {
                    // distribute the consumes to the threads - the first thread gets the remainder
                    thread_consume_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_consume_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow consumes only to the first thread, and reserve the last core to it
                    if (thread_index == m_thread_count - 1)
                    {
                        thread_consume_count = i_target_put_count;
                        thread_affinity      = uint64_t(1) << (num_of_processors - 1);
                    }
                    else
                    {
                        thread_affinity ^= uint64_t(1) << (num_of_processors - 1);
                    }
                }

                if (num_of_processors <= 1)
                    thread_affinity = std::numeric_limits<uint64_t>::max();

                threads[thread_index].start(
                  thread_index, thread_put_count, thread_consume_count, thread_affinity);
            }

            // wait for the test to be completed
            {
                LineUpdaterStreamAdapter line(m_output);
                bool                     complete = false;
                Progress                 progress(i_target_put_count);
                while (!complete)
                {
                    size_t produced = 0, consumed = 0;
                    size_t active_threads = 0;
                    for (auto & thread : threads)
                    {
                        produced += thread.incremental_stats().m_produced.load();
                        consumed += thread.incremental_stats().m_consumed.load();
                        active_threads +=
                          thread.incremental_stats().m_thread_is_active.load() ? 1 : 0;
                    }
                    DENSITY_TEST_ASSERT(
                      consumed <= i_target_put_count && produced <= i_target_put_count);
                    complete = consumed >= i_target_put_count && produced >= i_target_put_count;

                    bool too_many_enqueued = false;
                    if (produced > consumed)
                    {
                        double const enqueued_ratio =
                          static_cast<double>(produced - consumed) / static_cast<double>(consumed);
                        too_many_enqueued = enqueued_ratio > 0.2;
                    }
                    feedback.m_too_many_enqueued.store(
                      too_many_enqueued, std::memory_order_relaxed);

                    if (i_flags && QueueTesterFlags::ePrintProgress)
                    {
                        auto const enqueued = produced >= consumed ? (produced - consumed) : 0;
                        progress.set_progress(consumed);
                        line << "Active threads: " << active_threads << ", Consumed: " << consumed
                             << " (" << progress << "), enqueued: " << enqueued << std::endl;
                    }

                    if (!complete)
                    {
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    }
                }
            }

            for (auto & thread : threads)
            {
                thread.join();
            }

            histogram<int64_t> histogram_spawned("spawned by i-th thread");
            histogram<int64_t> histogram_except_puts("exceptions_during_puts");
            histogram<int64_t> histogram_except_cons("exceptions_during_consumes");

            FinalStats final_state(m_put_cases.size());
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                auto const & thread_state = threads[thread_index].final_stats();
                final_state += thread_state;

                auto const spawned = std::accumulate(
                  thread_state.m_counters.begin(),
                  thread_state.m_counters.end(),
                  static_cast<int64_t>(0),
                  [](int64_t i_sum, const PutTypeCounters & i_counter) {
                      return i_sum + i_counter.m_spawned;
                  });
                histogram_spawned << spawned;

                if (with_exceptions)
                {
                    histogram_except_puts << thread_state.m_exceptions_during_puts;
                    histogram_except_cons << thread_state.m_exceptions_during_consumes;
                }
            }

            for (auto const & counter : final_state.m_counters)
            {
                DENSITY_TEST_ASSERT(counter.m_existing == 0);
            }

            m_output << histogram_spawned;
            if (with_exceptions)
            {
                m_output << histogram_except_puts;
                m_output << histogram_except_cons;
            }
        }